

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_traphi_32(void)

{
  uint uVar1;
  uint addr_in;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    uVar1 = m68ki_cpu.x_flag >> 4;
    uVar2 = m68ki_cpu.n_flag >> 4;
    bVar6 = m68ki_cpu.not_z_flag == 0;
    uVar4 = m68ki_cpu.v_flag >> 6;
    uVar5 = m68ki_cpu.c_flag >> 8;
    uVar3 = (m68ki_cpu.s_flag | m68ki_cpu.m_flag) << 0xb | m68ki_cpu.t0_flag | m68ki_cpu.t1_flag |
            m68ki_cpu.int_mask;
    m68ki_cpu.t1_flag = 0;
    m68ki_cpu.t0_flag = 0;
    m68ki_cpu.sp[m68ki_cpu.s_flag >> 1 & m68ki_cpu.m_flag | m68ki_cpu.s_flag] = m68ki_cpu.dar[0xf];
    m68ki_cpu.s_flag = 4;
    m68ki_cpu.dar[0xf] = m68ki_cpu.sp[(ulong)(m68ki_cpu.m_flag & 2) + 4];
    m68ki_stack_frame_0000
              (m68ki_cpu.ppc,
               uVar2 & 8 | uVar1 & 0x10 | (uint)bVar6 << 2 | uVar4 & 2 | uVar5 & 1 | uVar3,4);
    addr_in = m68ki_cpu.vbr + 0x10;
    m68ki_cpu.pc = addr_in;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    m68ki_cpu.pc = m68k_read_memory_32(addr_in & m68ki_cpu.address_mask);
    m68ki_remaining_cycles =
         m68ki_remaining_cycles +
         ((uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir] - (uint)m68ki_cpu.cyc_exception[4]);
    return;
  }
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  if (((m68ki_cpu.c_flag & 0x100) == 0) && (m68ki_cpu.not_z_flag != 0)) {
    m68ki_exception_trap(7);
    return;
  }
  return;
}

Assistant:

static void m68k_op_traphi_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		REG_PC += 4;  /* JFF increase before or 1) stackframe is incorrect 2) RTE address is wrong if trap is taken */
		if(COND_HI())
		{
			m68ki_exception_trap(EXCEPTION_TRAPV);	/* HJB 990403 */
			return;
		}
		return;
	}
	m68ki_exception_illegal();
}